

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O3

const_iterator __thiscall
solitaire::Solitaire::initializeTableauPilesAndReturnFirstNotUsedCard(Solitaire *this,Deck *deck)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  const_iterator firstNotUsedCard;
  const_iterator firstPileCard;
  Deck *local_38;
  Deck *local_30;
  
  lVar2 = 8;
  lVar3 = 0;
  local_38 = deck;
  do {
    local_30 = local_38;
    local_38 = (Deck *)((long)&local_38->field_0x0 + lVar2);
    plVar1 = *(long **)((long)&(this->tableauPiles)._M_elems[0].
                               super___shared_ptr<solitaire::piles::interfaces::TableauPile,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar3);
    (**(code **)(*plVar1 + 0x18))(plVar1,&local_30,&local_38);
    lVar2 = lVar2 + 8;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x70);
  return (const_iterator)local_38;
}

Assistant:

Deck::const_iterator
Solitaire::initializeTableauPilesAndReturnFirstNotUsedCard(const Deck& deck) {
    auto firstNotUsedCard = deck.begin();
    unsigned currentPileCardsCount = 1;

    for (auto& pile: tableauPiles) {
        const auto firstPileCard = firstNotUsedCard;
        std::advance(firstNotUsedCard, currentPileCardsCount++);
        pile->initialize(firstPileCard, firstNotUsedCard);
    }

    return firstNotUsedCard;
}